

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void gai_print_range(char *pre,int ndim,Integer *lo,Integer *hi,char *post)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int i;
  int local_2c;
  
  printf("%s[",in_RDI);
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    printf("%ld:%ld",*(undefined8 *)(in_RDX + (long)local_2c * 8),
           *(undefined8 *)(in_RCX + (long)local_2c * 8));
    if (local_2c == in_ESI + -1) {
      printf("] %s",in_R8);
    }
    else {
      printf(",");
    }
  }
  return;
}

Assistant:

static void gai_print_range(char *pre,int ndim, 
                            Integer lo[], Integer hi[], char* post)
{
        int i;

        printf("%s[",pre);
        for(i=0;i<ndim;i++){
                printf("%ld:%ld",(long)lo[i],(long)hi[i]);
                if(i==ndim-1)printf("] %s",post);
                else printf(",");
        }
}